

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void test_gpt_tokenizer(gpt_vocab *vocab,string *fpath_test)

{
  long lVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined8 uVar4;
  size_type sVar5;
  int *t_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<int,_std::allocator<int>_> *__range3_1;
  int *t;
  const_iterator __end3;
  const_iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  vector<int,_std::allocator<int>_> tokens;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  *test;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range1;
  size_t n_fails;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  tests;
  string *in_stack_00000170;
  gpt_vocab *in_stack_00000178;
  string *in_stack_000001c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffffee8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  FILE *pFVar6;
  FILE *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff28;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  undefined1 *local_b8;
  uint *local_b0;
  int *local_a8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  vector<int,_std::allocator<int>_> *local_98;
  undefined1 local_80 [24];
  reference local_68;
  _Self local_60;
  _Self local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [64];
  
  extract_tests_from_file(in_stack_000001c8);
  local_48 = 0;
  local_50 = local_40;
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::begin(in_stack_fffffffffffffee8);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::end(in_stack_fffffffffffffee8);
  while (bVar2 = std::operator!=(&local_58,&local_60), lVar1 = local_48, bVar2) {
    local_68 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                            *)0x17222d);
    gpt_tokenize(in_stack_00000178,in_stack_00000170);
    uVar3 = std::operator!=(in_stack_fffffffffffffef0,
                            (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8);
    pFVar6 = _stderr;
    if ((bool)uVar3) {
      local_48 = local_48 + 1;
      uVar4 = std::__cxx11::string::c_str();
      fprintf(pFVar6,"%s : failed test: \'%s\'\n","test_gpt_tokenizer",uVar4);
      fprintf(_stderr,"%s : tokens in hf:   ","test_gpt_tokenizer");
      local_98 = &local_68->second;
      local_a0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8);
      local_a8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 *)in_stack_fffffffffffffef0,
                                (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 *)in_stack_fffffffffffffee8), bVar2) {
        local_b0 = (uint *)__gnu_cxx::
                           __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator*(&local_a0);
        pFVar6 = _stderr;
        std::
        map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](in_stack_ffffffffffffff30,
                     (key_type_conflict *)CONCAT17(uVar3,in_stack_ffffffffffffff28));
        uVar4 = std::__cxx11::string::c_str();
        fprintf(pFVar6,"%s(%d), ",uVar4,(ulong)*local_b0);
        __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
        operator++(&local_a0);
      }
      fprintf(_stderr,"\n");
      fprintf(_stderr,"%s : tokens in ggml: ","test_gpt_tokenizer");
      local_b8 = local_80;
      local_c0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffee8);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffef0,
                                (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )in_stack_fffffffffffffee8), bVar2) {
        in_stack_ffffffffffffff30 =
             (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_c0);
        in_stack_ffffffffffffff00 = _stderr;
        std::
        map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](in_stack_ffffffffffffff30,
                     (key_type_conflict *)CONCAT17(uVar3,in_stack_ffffffffffffff28));
        uVar4 = std::__cxx11::string::c_str();
        fprintf(in_stack_ffffffffffffff00,"%s(%d), ",uVar4,(ulong)*(uint *)in_stack_ffffffffffffff30
               );
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_c0);
      }
      fprintf(_stderr,"\n");
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
                  *)in_stack_fffffffffffffef0);
  }
  pFVar6 = _stderr;
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)0x172534);
  fprintf(pFVar6,"%s : %zu tests failed out of %zu tests.\n","test_gpt_tokenizer",lVar1,sVar5);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)0x172563);
  return;
}

Assistant:

void test_gpt_tokenizer(gpt_vocab & vocab, const std::string & fpath_test){
    std::map<std::string, std::vector<gpt_vocab::id>> tests = extract_tests_from_file(fpath_test);

    size_t n_fails = 0;

    for (const auto & test : tests) {
        std::vector<gpt_vocab::id> tokens = gpt_tokenize(vocab, test.first);

        if (tokens != test.second){
            n_fails++;

            // print out failure cases
            fprintf(stderr, "%s : failed test: '%s'\n", __func__, test.first.c_str());
            fprintf(stderr, "%s : tokens in hf:   ", __func__);
            for (const auto & t : test.second) {
                fprintf(stderr, "%s(%d), ", vocab.id_to_token[t].c_str(), t);
            }
            fprintf(stderr, "\n");
            fprintf(stderr, "%s : tokens in ggml: ", __func__);
            for (const auto & t : tokens) {
                fprintf(stderr, "%s(%d), ", vocab.id_to_token[t].c_str(), t);
            }
            fprintf(stderr, "\n");
        }
    }

    fprintf(stderr, "%s : %zu tests failed out of %zu tests.\n", __func__, n_fails, tests.size());
}